

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_andnot(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint8_t *puVar1;
  ushort key;
  ushort uVar2;
  uint32_t cap;
  uint16_t *puVar3;
  uint16_t *puVar4;
  long lVar5;
  roaring_array_t *prVar6;
  uint uVar7;
  int *c;
  roaring_bitmap_t *prVar8;
  int iVar9;
  uint32_t uVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint8_t uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint32_t end_index;
  uint32_t uVar21;
  uint32_t start_index;
  bool bVar22;
  uint8_t result_type;
  uint8_t local_45;
  uint local_44;
  roaring_array_t *local_40;
  ulong local_38;
  
  local_45 = '\0';
  cap = (x1->high_low_container).size;
  if (cap == 0) {
    prVar8 = roaring_bitmap_create_with_capacity(0);
    if ((((x1->high_low_container).flags & 1) == 0) && (((x2->high_low_container).flags & 1) == 0))
    {
      puVar1 = &(prVar8->high_low_container).flags;
      *puVar1 = *puVar1 & 0xfe;
    }
    else {
      puVar1 = &(prVar8->high_low_container).flags;
      *puVar1 = *puVar1 | 1;
    }
    return prVar8;
  }
  local_44 = (x2->high_low_container).size;
  if (local_44 == 0) {
    prVar8 = roaring_bitmap_copy(x1);
    return prVar8;
  }
  local_40 = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
  if ((((x1->high_low_container).flags & 1) == 0) && (((x2->high_low_container).flags & 1) == 0)) {
    local_40->flags = local_40->flags & 0xfe;
  }
  else {
    local_40->flags = local_40->flags | 1;
  }
  uVar12 = 0;
  start_index = 0;
LAB_0010956d:
  do {
    uVar13 = uVar12 & 0xffff;
    local_38 = uVar12;
    while( true ) {
      puVar3 = (x1->high_low_container).keys;
      uVar17 = start_index & 0xffff;
      key = puVar3[uVar17];
      puVar4 = (x2->high_low_container).keys;
      uVar2 = puVar4[uVar13];
      if (key == uVar2) break;
      if (uVar2 <= key) {
        uVar7 = (x2->high_low_container).size;
        uVar15 = (int)local_38 + 1;
        uVar17 = uVar15;
        if (((int)uVar7 <= (int)uVar15) || (key <= puVar4[(int)uVar15])) goto LAB_0010971b;
        uVar20 = (int)local_38 + 2;
        iVar19 = 1;
        if ((int)uVar7 <= (int)uVar20) goto LAB_00109704;
        iVar19 = 1;
        goto LAB_001096eb;
      }
      uVar21 = (x1->high_low_container).size;
      uVar10 = start_index + 1;
      end_index = uVar10;
      if (((int)uVar10 < (int)uVar21) && (puVar3[(int)uVar10] < uVar2)) {
        uVar14 = start_index + 2;
        iVar19 = 1;
        if ((int)uVar14 < (int)uVar21) {
          iVar9 = 1;
          do {
            iVar19 = iVar9;
            if (uVar2 <= puVar3[(int)uVar14]) goto LAB_001095ec;
            iVar19 = iVar9 * 2;
            uVar14 = uVar10 + iVar9 * 2;
            iVar9 = iVar19;
          } while ((int)uVar14 < (int)uVar21);
        }
        uVar14 = uVar21 - 1;
LAB_001095ec:
        end_index = uVar14;
        if (((puVar3[(int)uVar14] != uVar2) && (end_index = uVar21, uVar2 <= puVar3[(int)uVar14]))
           && (end_index = uVar14, (iVar19 >> 1) + uVar10 + 1 != uVar14)) {
          uVar10 = (iVar19 >> 1) + uVar10;
          do {
            end_index = (int)(uVar10 + uVar14) >> 1;
            if (puVar3[(int)end_index] == uVar2) break;
            uVar21 = end_index;
            if (puVar3[(int)end_index] < uVar2) {
              uVar21 = uVar14;
              uVar10 = end_index;
            }
            end_index = uVar21;
            uVar14 = uVar21;
          } while (uVar10 + 1 != uVar21);
        }
      }
      ra_append_copy_range
                (local_40,&x1->high_low_container,start_index,end_index,
                 (_Bool)((x1->high_low_container).flags & 1));
      start_index = end_index;
      if (end_index == cap) {
        uVar17 = (uint)local_38;
        goto LAB_001097ef;
      }
    }
    c = (int *)container_andnot((x1->high_low_container).containers[uVar17],
                                (x1->high_low_container).typecodes[uVar17],
                                (x2->high_low_container).containers[uVar13],
                                (x2->high_low_container).typecodes[uVar13],&local_45);
    uVar12 = local_38;
    piVar11 = c;
    uVar16 = local_45;
    if (local_45 == '\x04') {
      uVar16 = (uint8_t)c[2];
      piVar11 = *(int **)c;
    }
    iVar19 = *piVar11;
    if ((uVar16 == '\x03') || (uVar16 == '\x02')) {
      bVar22 = 0 < iVar19;
    }
    else {
      if (iVar19 == -1) {
        if (**(long **)(piVar11 + 2) == 0) {
          uVar13 = 0xffffffffffffffff;
          do {
            if (uVar13 == 0x3fe) {
              uVar18 = 0x3ff;
              break;
            }
            uVar18 = uVar13 + 1;
            lVar5 = uVar13 + 2;
            uVar13 = uVar18;
          } while ((*(long **)(piVar11 + 2))[lVar5] == 0);
          bVar22 = 0x3fe < uVar18;
        }
        else {
          bVar22 = false;
        }
      }
      else {
        bVar22 = iVar19 == 0;
      }
      bVar22 = (bool)(bVar22 ^ 1);
    }
    if (bVar22) {
      ra_append(local_40,key,c,local_45);
    }
    else {
      container_free(c,local_45);
    }
    start_index = start_index + 1;
    uVar17 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar17;
  } while ((start_index != cap) && (uVar17 != local_44));
  goto LAB_001097ef;
  while( true ) {
    iVar9 = iVar19 * 2;
    uVar20 = uVar15 + iVar19 * 2;
    iVar19 = iVar9;
    if ((int)uVar7 <= (int)uVar20) break;
LAB_001096eb:
    if (key <= puVar4[(int)uVar20]) goto LAB_0010970a;
  }
LAB_00109704:
  uVar20 = uVar7 - 1;
LAB_0010970a:
  uVar17 = uVar20;
  if (((puVar4[(int)uVar20] != key) && (uVar17 = uVar7, key <= puVar4[(int)uVar20])) &&
     (uVar17 = uVar20, (iVar19 >> 1) + uVar15 + 1 != uVar20)) {
    uVar15 = (iVar19 >> 1) + uVar15;
    do {
      uVar17 = (int)(uVar15 + uVar20) >> 1;
      if (puVar4[(int)uVar17] == key) break;
      uVar7 = uVar17;
      if (puVar4[(int)uVar17] < key) {
        uVar7 = uVar20;
        uVar15 = uVar17;
      }
      uVar17 = uVar7;
      uVar20 = uVar7;
    } while (uVar15 + 1 != uVar7);
  }
LAB_0010971b:
  uVar12 = (ulong)uVar17;
  if (uVar17 == local_44) {
LAB_001097ef:
    prVar6 = local_40;
    if (uVar17 != local_44) {
      return (roaring_bitmap_t *)local_40;
    }
    ra_append_copy_range
              (local_40,&x1->high_low_container,start_index,cap,
               (_Bool)((x1->high_low_container).flags & 1));
    return (roaring_bitmap_t *)prVar6;
  }
  goto LAB_0010956d;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_andnot(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        roaring_bitmap_t *empty_bitmap = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(empty_bitmap,
                                         is_cow(x1) || is_cow(x2));
        return empty_bitmap;
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(length1);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = 0;
    uint16_t s2 = 0;
    while (true) {
        s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_andnot(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
        } else if (s1 < s2) {  // s1 < s2
            const int next_pos1 =
                ra_advance_until(&x1->high_low_container, s2, pos1);
            ra_append_copy_range(&answer->high_low_container,
                                 &x1->high_low_container, pos1, next_pos1,
                                 is_cow(x1));
            // TODO : perhaps some of the copy_on_write should be based on
            // answer rather than x1 (more stringent?).  Many similar cases
            pos1 = next_pos1;
            if (pos1 == length1) break;
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
        }
    }
    if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}